

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Entity_test.cc
# Opt level: O2

int size<entityx::EntityManager::UnpackingView<Position>>(UnpackingView<Position> *t)

{
  int iVar1;
  UnpackingView<Position> *__range1;
  Iterator __end0;
  Iterator __begin0;
  Iterator IStack_78;
  Iterator local_48;
  
  entityx::EntityManager::UnpackingView<Position>::begin(&local_48,t);
  entityx::EntityManager::UnpackingView<Position>::end(&IStack_78,t);
  iVar1 = 0;
  while (local_48.
         super_ViewIterator<entityx::EntityManager::UnpackingView<Position>::Iterator,_false>.i_ !=
         IStack_78.
         super_ViewIterator<entityx::EntityManager::UnpackingView<Position>::Iterator,_false>.i_) {
    iVar1 = iVar1 + 1;
    entityx::EntityManager::
    ViewIterator<entityx::EntityManager::UnpackingView<Position>::Iterator,_false>::operator++
              (&local_48.
                super_ViewIterator<entityx::EntityManager::UnpackingView<Position>::Iterator,_false>
              );
  }
  return iVar1;
}

Assistant:

int size(const T &t) {
  int n = 0;
  for (auto i : t) {
    ++n;
    (void)i;  // Unused on purpose, suppress warning
  }
  return n;
}